

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O3

void __thiscall ZXing::Content::switchEncoding(Content *this,ECI eci,bool isECI)

{
  pointer pEVar1;
  byte bVar2;
  undefined3 in_register_00000011;
  Encoding local_18;
  
  bVar2 = this->hasECI;
  if (CONCAT31(in_register_00000011,isECI) == 0) {
    if ((bool)bVar2 != false) goto LAB_00132b03;
  }
  else if (((bool)bVar2 == false) &&
          (pEVar1 = (this->encodings).
                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          (this->encodings).
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish != pEVar1)) {
    (this->encodings).
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar1;
  }
  local_18.pos = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
  local_18.eci = eci;
  std::vector<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>::
  emplace_back<ZXing::Content::Encoding>(&this->encodings,&local_18);
  bVar2 = this->hasECI;
LAB_00132b03:
  this->hasECI = (bool)(bVar2 | isECI);
  return;
}

Assistant:

void Content::switchEncoding(ECI eci, bool isECI)
{
	// remove all non-ECI entries on first ECI entry
	if (isECI && !hasECI)
		encodings.clear();
	if (isECI || !hasECI)
		encodings.push_back({eci, Size(bytes)});

	hasECI |= isECI;
}